

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int bid_keycmp(char *p,char *key,ssize_t len)

{
  bool bVar1;
  int match_len;
  ssize_t len_local;
  char *key_local;
  char *p_local;
  
  match_len = 0;
  len_local = len;
  key_local = key;
  p_local = p;
  while( true ) {
    bVar1 = false;
    if ((0 < len_local) && (bVar1 = false, *p_local != '\0')) {
      bVar1 = *key_local != '\0';
    }
    if (!bVar1) break;
    if (*p_local != *key_local) {
      return 0;
    }
    len_local = len_local + -1;
    p_local = p_local + 1;
    key_local = key_local + 1;
    match_len = match_len + 1;
  }
  if (*key_local != '\0') {
    return 0;
  }
  if (((((*p_local != '=') && (*p_local != ' ')) && (*p_local != '\t')) &&
      ((*p_local != '\n' && (*p_local != '\r')))) &&
     ((*p_local != '\\' || ((p_local[1] != '\n' && (p_local[1] != '\r')))))) {
    return 0;
  }
  return match_len;
}

Assistant:

static int
bid_keycmp(const char *p, const char *key, ssize_t len)
{
	int match_len = 0;

	while (len > 0 && *p && *key) {
		if (*p == *key) {
			--len;
			++p;
			++key;
			++match_len;
			continue;
		}
		return (0);/* Not match */
	}
	if (*key != '\0')
		return (0);/* Not match */

	/* A following character should be specified characters */
	if (p[0] == '=' || p[0] == ' ' || p[0] == '\t' ||
	    p[0] == '\n' || p[0] == '\r' ||
	   (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r')))
		return (match_len);
	return (0);/* Not match */
}